

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_misc_functions.cc
# Opt level: O2

unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> __thiscall
draco::CreateCornerTableFromAttribute(draco *this,Mesh *mesh,Type type)

{
  bool bVar1;
  pointer paVar2;
  PointAttribute *pPVar3;
  long lVar4;
  FaceIndex i;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  faces;
  FaceType new_face;
  
  pPVar3 = PointCloud::GetNamedAttribute(&mesh->super_PointCloud,type);
  if (pPVar3 == (PointAttribute *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
    ::IndexTypeVector(&faces,((long)(mesh->faces_).vector_.
                                    super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(mesh->faces_).vector_.
                                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0xc & 0xffffffff);
    new_face._M_elems[2].value_ = 0;
    new_face._M_elems[0].value_ = 0;
    new_face._M_elems[1].value_ = 0;
    lVar6 = 0;
    for (uVar5 = 0;
        paVar2 = (mesh->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (((long)(mesh->faces_).vector_.
                        super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2) / 0xc &
                0xffffffffU); uVar5 = uVar5 + 1) {
      bVar1 = pPVar3->identity_mapping_;
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        uVar7 = *(uint *)((long)(paVar2->_M_elems + lVar4) + lVar6);
        if (bVar1 == false) {
          uVar7 = (pPVar3->indices_map_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
        }
        new_face._M_elems[lVar4].value_ = uVar7;
      }
      std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>::operator=
                (faces.vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5,&new_face);
      lVar6 = lVar6 + 0xc;
    }
    CornerTable::Create((CornerTable *)this,&faces);
    std::
    _Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                     *)&faces);
  }
  return (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CornerTable> CreateCornerTableFromAttribute(
    const Mesh *mesh, GeometryAttribute::Type type) {
  typedef CornerTable::FaceType FaceType;

  const PointAttribute *const att = mesh->GetNamedAttribute(type);
  if (att == nullptr) {
    return nullptr;
  }
  IndexTypeVector<FaceIndex, FaceType> faces(mesh->num_faces());
  FaceType new_face;
  for (FaceIndex i(0); i < mesh->num_faces(); ++i) {
    const Mesh::Face &face = mesh->face(i);
    for (int j = 0; j < 3; ++j) {
      // Map general vertex indices to attribute indices.
      new_face[j] = att->mapped_index(face[j]).value();
    }
    faces[FaceIndex(i)] = new_face;
  }
  // Build the corner table.
  return CornerTable::Create(faces);
}